

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void roaring_bitmap_add_range_closed(roaring_bitmap_t *r,uint32_t min,uint32_t max)

{
  ushort uVar1;
  uint uVar2;
  uint8_t *puVar3;
  array_container_t *c;
  bool bVar4;
  uint uVar5;
  shared_container_t *sc;
  array_container_t *paVar6;
  uint16_t *puVar7;
  uint in_ECX;
  int iVar8;
  long lVar9;
  int iVar10;
  roaring_bitmap_t *prVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar16;
  uint uVar17;
  uint32_t min_00;
  ushort uVar18;
  uint uVar19;
  uint32_t max_00;
  ulong uVar20;
  int iVar21;
  uint8_t new_type;
  uint8_t local_71;
  uint32_t local_70;
  uint32_t local_6c;
  roaring_bitmap_t *local_68;
  ulong local_60;
  int local_54;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  roaring_bitmap_t *prVar15;
  
  if (min <= max) {
    uVar19 = min >> 0x10;
    uVar5 = max >> 0x10;
    puVar7 = (r->high_low_container).keys;
    uVar2 = (r->high_low_container).size;
    uVar17 = 0;
    uVar14 = 0;
    prVar15 = r;
    if (uVar2 != 0) {
      prVar11 = (roaring_bitmap_t *)(ulong)(uVar2 - 1);
      uVar14 = 0;
      do {
        if ((int)prVar11 < (int)uVar14) {
          uVar13 = ~uVar14;
          break;
        }
        uVar16 = uVar14 + (int)prVar11;
        uVar13 = uVar16 >> 1;
        prVar15 = (roaring_bitmap_t *)(ulong)uVar13;
        uVar1 = *(ushort *)((long)puVar7 + (ulong)(uVar16 & 0xfffffffe));
        local_60._0_2_ = (ushort)(max >> 0x10);
        if (uVar1 < (ushort)local_60) {
          uVar14 = uVar13 + 1;
          bVar4 = true;
          prVar15 = (roaring_bitmap_t *)(ulong)uVar14;
          uVar13 = in_ECX;
        }
        else if ((ushort)local_60 < uVar1) {
          prVar11 = (roaring_bitmap_t *)(ulong)(uVar13 - 1);
          bVar4 = true;
          prVar15 = prVar11;
          uVar13 = in_ECX;
        }
        else {
          bVar4 = false;
        }
        in_ECX = uVar13;
      } while (bVar4);
      uVar14 = uVar13 + 1;
      if (-1 < (int)uVar13) {
        uVar14 = ~uVar13;
      }
      uVar14 = uVar14 + uVar2;
    }
    if (uVar2 != uVar14) {
      iVar21 = uVar2 + ~uVar14;
      uVar13 = 0;
      do {
        if (iVar21 < (int)uVar13) {
          uVar17 = ~uVar13;
          break;
        }
        uVar17 = uVar13 + iVar21 >> 1;
        uVar1 = *(ushort *)((long)puVar7 + (ulong)(uVar13 + iVar21 & 0xfffffffe));
        uVar18 = (ushort)(min >> 0x10);
        if (uVar1 < uVar18) {
          uVar13 = uVar17 + 1;
          bVar4 = true;
        }
        else if (uVar18 < uVar1) {
          iVar21 = uVar17 - 1;
          bVar4 = true;
        }
        else {
          bVar4 = false;
          prVar15 = (roaring_bitmap_t *)(ulong)uVar17;
        }
        uVar17 = (uint)prVar15;
      } while (bVar4);
      uVar17 = (int)uVar17 >> 0x1f ^ uVar17;
    }
    iVar21 = (uVar2 - uVar14) - uVar17;
    local_6c = min;
    local_68 = r;
    local_60 = (ulong)uVar5;
    if (iVar21 <= (int)(uVar5 - uVar19)) {
      ra_shift_tail(&r->high_low_container,uVar14,((uVar5 - uVar19) - iVar21) + 1);
    }
    if ((uint)local_60 != uVar19 - 1) {
      uVar12 = (ulong)((uVar17 + iVar21) - 1);
      local_6c = local_6c & 0xffff;
      local_70 = max & 0xffff;
      local_40 = (long)(int)(~uVar14 + (local_68->high_low_container).size);
      local_48 = local_40 * 2;
      local_50 = local_40 * 8;
      iVar21 = ~(uint)local_60 + uVar19;
      local_38 = -uVar19 + local_60;
      lVar9 = 0;
      do {
        iVar8 = (int)lVar9;
        min_00 = 0;
        if ((int)local_38 + iVar8 == 0) {
          min_00 = local_6c;
        }
        max_00 = 0xffff;
        if (iVar8 == 0) {
          max_00 = local_70;
        }
        iVar10 = (int)uVar12;
        if ((iVar10 < 0) ||
           ((int)local_60 + iVar8 != (uint)(local_68->high_low_container).keys[uVar12])) {
          if ((max_00 - min_00) + 2 < 3) {
            local_71 = '\x02';
            paVar6 = array_container_create_range(min_00,max_00 + 1);
          }
          else {
            local_71 = '\x03';
            paVar6 = (array_container_t *)(*global_memory_hook.malloc)(0x10);
            if (paVar6 == (array_container_t *)0x0) {
LAB_001194a0:
              paVar6 = (array_container_t *)0x0;
            }
            else {
              puVar7 = (uint16_t *)(*global_memory_hook.malloc)(4);
              paVar6->array = puVar7;
              if (puVar7 == (uint16_t *)0x0) {
                (*global_memory_hook.free)(paVar6);
                goto LAB_001194a0;
              }
              paVar6->cardinality = 0;
              paVar6->capacity = 1;
            }
            if (paVar6 != (array_container_t *)0x0) {
              *(uint32_t *)(paVar6->array + (long)paVar6->cardinality * 2) =
                   (max_00 - min_00) * 0x10000 | min_00;
              paVar6->cardinality = paVar6->cardinality + 1;
            }
          }
        }
        else {
          uVar20 = uVar12 & 0xffff;
          puVar3 = (local_68->high_low_container).typecodes;
          sc = (shared_container_t *)(local_68->high_low_container).containers[uVar20];
          local_54 = iVar10;
          if (puVar3[uVar20] == '\x04') {
            sc = (shared_container_t *)shared_container_extract_copy(sc,puVar3 + uVar20);
          }
          (local_68->high_low_container).containers[uVar20] = sc;
          paVar6 = (array_container_t *)
                   container_add_range((local_68->high_low_container).containers[uVar12],
                                       (local_68->high_low_container).typecodes[uVar12],min_00,
                                       max_00,&local_71);
          c = (array_container_t *)(local_68->high_low_container).containers[uVar12];
          if (paVar6 != c) {
            container_free(c,(local_68->high_low_container).typecodes[uVar12]);
          }
          uVar12 = (ulong)(local_54 - 1);
        }
        *(short *)((long)(local_68->high_low_container).keys + lVar9 * 2 + local_48) =
             (short)local_60 + (short)lVar9;
        *(array_container_t **)
         ((long)(local_68->high_low_container).containers + lVar9 * 8 + local_50) = paVar6;
        (local_68->high_low_container).typecodes[lVar9 + local_40] = local_71;
        lVar9 = lVar9 + -1;
        iVar21 = iVar21 + 1;
      } while (iVar21 != 0);
    }
  }
  return;
}

Assistant:

void roaring_bitmap_add_range_closed(roaring_bitmap_t *r, uint32_t min,
                                     uint32_t max) {
    if (min > max) {
        return;
    }

    roaring_array_t *ra = &r->high_low_container;

    uint32_t min_key = min >> 16;
    uint32_t max_key = max >> 16;

    int32_t num_required_containers = max_key - min_key + 1;
    int32_t suffix_length =
        count_greater(ra->keys, ra->size, (uint16_t)max_key);
    int32_t prefix_length =
        count_less(ra->keys, ra->size - suffix_length, (uint16_t)min_key);
    int32_t common_length = ra->size - prefix_length - suffix_length;

    if (num_required_containers > common_length) {
        ra_shift_tail(ra, suffix_length,
                      num_required_containers - common_length);
    }

    int32_t src = prefix_length + common_length - 1;
    int32_t dst = ra->size - suffix_length - 1;
    for (uint32_t key = max_key; key != min_key - 1;
         key--) {  // beware of min_key==0
        uint32_t container_min = (min_key == key) ? (min & 0xffff) : 0;
        uint32_t container_max = (max_key == key) ? (max & 0xffff) : 0xffff;
        container_t *new_container;
        uint8_t new_type;

        if (src >= 0 && ra->keys[src] == key) {
            ra_unshare_container_at_index(ra, (uint16_t)src);
            new_container =
                container_add_range(ra->containers[src], ra->typecodes[src],
                                    container_min, container_max, &new_type);
            if (new_container != ra->containers[src]) {
                container_free(ra->containers[src], ra->typecodes[src]);
            }
            src--;
        } else {
            new_container = container_from_range(&new_type, container_min,
                                                 container_max + 1, 1);
        }
        ra_replace_key_and_container_at_index(ra, dst, (uint16_t)key,
                                              new_container, new_type);
        dst--;
    }
}